

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  hugeint_t *phVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar6;
  int64_t iVar7;
  byte bVar8;
  byte bVar9;
  bool bVar10;
  BoundFunctionExpression *pBVar11;
  pointer pFVar12;
  const_reference pvVar13;
  pointer pEVar14;
  long lVar15;
  reference vector;
  ulong uVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  _Head_base<0UL,_unsigned_long_*,_false> _Var18;
  idx_t iVar19;
  unsigned_long uVar20;
  ulong uVar21;
  idx_t idx_in_entry;
  ulong uVar22;
  idx_t iVar23;
  undefined1 *puVar24;
  int64_t *piVar25;
  hugeint_t hVar26;
  hugeint_t addition;
  idx_t local_110;
  hugeint_t local_108;
  data_ptr_t local_f0;
  hugeint_t local_e8;
  ulong local_d8;
  buffer_ptr<ValidityBuffer> *local_d0;
  hugeint_t local_c8;
  hugeint_t local_b8;
  hugeint_t local_a8;
  reference local_98;
  ulong local_90;
  UnifiedVectorFormat local_88;
  unsigned_long local_38;
  
  pBVar11 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar12 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar11->bind_info);
  pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar11->children,0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar13);
  bVar8 = DecimalType::GetScale(&pEVar14->return_type);
  pvVar13 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar11->children,0);
  pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar13);
  bVar9 = DecimalType::GetWidth(&pEVar14->return_type);
  iVar1 = *(int *)&pFVar12[1]._vptr_FunctionData;
  if ((int)((uint)bVar8 - (uint)bVar9) < iVar1) {
    lVar15 = (long)(int)((uint)bVar8 - iVar1) * 0x10;
    local_b8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar15);
    local_b8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar15 + 8);
    local_c8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (long)iVar1 * -0x10);
    local_c8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + (long)iVar1 * -0x10 + 8);
    hugeint_t::hugeint_t((hugeint_t *)&local_88,2);
    local_e8 = hugeint_t::operator/(&local_b8,(hugeint_t *)&local_88);
    vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    local_110 = input->count;
    if (vector->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar3 = result->data;
      local_f0 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        if (local_110 != 0) {
          lVar15 = 0;
          do {
            local_88.sel = *(SelectionVector **)(local_f0 + lVar15);
            local_88.data = *(data_ptr_t *)(local_f0 + lVar15 + 8);
            hugeint_t::hugeint_t(&local_108,0);
            bVar10 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
            if (bVar10) {
              hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
            }
            else {
              hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
            }
            local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
            hVar26 = hugeint_t::operator*(&local_108,&local_c8);
            *(uint64_t *)(pdVar3 + lVar15) = hVar26.lower;
            *(int64_t *)(pdVar3 + lVar15 + 8) = hVar26.upper;
            lVar15 = lVar15 + 0x10;
            local_110 = local_110 - 1;
          } while (local_110 != 0);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < local_110 + 0x3f) {
          local_90 = local_110 + 0x3f >> 6;
          local_d8 = 0;
          uVar22 = 0;
          local_98 = vector;
          do {
            puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar16 = uVar22 + 0x40;
              if (local_110 <= uVar22 + 0x40) {
                uVar16 = local_110;
              }
LAB_00fc2fb5:
              uVar21 = uVar22;
              if (uVar22 < uVar16) {
                lVar15 = uVar22 << 4;
                do {
                  local_88.sel = *(SelectionVector **)(local_f0 + lVar15);
                  local_88.data = *(data_ptr_t *)(local_f0 + lVar15 + 8);
                  hugeint_t::hugeint_t(&local_108,0);
                  bVar10 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
                  if (bVar10) {
                    hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
                  }
                  else {
                    hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
                  }
                  local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                  hVar26 = hugeint_t::operator*(&local_108,&local_c8);
                  *(uint64_t *)(pdVar3 + lVar15) = hVar26.lower;
                  *(int64_t *)(pdVar3 + lVar15 + 8) = hVar26.upper;
                  uVar22 = uVar22 + 1;
                  lVar15 = lVar15 + 0x10;
                  uVar21 = uVar16;
                  vector = local_98;
                } while (uVar16 != uVar22);
              }
            }
            else {
              uVar20 = puVar4[local_d8];
              uVar16 = uVar22 + 0x40;
              if (local_110 <= uVar22 + 0x40) {
                uVar16 = local_110;
              }
              uVar21 = uVar16;
              if (uVar20 != 0) {
                if (uVar20 == 0xffffffffffffffff) goto LAB_00fc2fb5;
                local_d0 = (buffer_ptr<ValidityBuffer> *)(uVar16 - uVar22);
                uVar21 = uVar22;
                if (uVar22 <= uVar16 && local_d0 != (buffer_ptr<ValidityBuffer> *)0x0) {
                  lVar15 = uVar22 << 4;
                  puVar24 = (undefined1 *)0x0;
                  local_38 = uVar20;
                  do {
                    if ((uVar20 >> ((ulong)puVar24 & 0x3f) & 1) != 0) {
                      local_88.sel = *(SelectionVector **)(local_f0 + lVar15);
                      local_88.data = *(data_ptr_t *)(local_f0 + lVar15 + 8);
                      hugeint_t::hugeint_t(&local_108,0);
                      bVar10 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
                      if (bVar10) {
                        hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
                      }
                      else {
                        hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
                      }
                      local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                      hVar26 = hugeint_t::operator*(&local_108,&local_c8);
                      *(uint64_t *)(pdVar3 + lVar15) = hVar26.lower;
                      *(int64_t *)(pdVar3 + lVar15 + 8) = hVar26.upper;
                      uVar20 = local_38;
                    }
                    puVar24 = puVar24 + 1;
                    lVar15 = lVar15 + 0x10;
                    uVar21 = uVar16;
                    vector = local_98;
                  } while (local_d0 != (buffer_ptr<ValidityBuffer> *)puVar24);
                }
              }
            }
            local_d8 = local_d8 + 1;
            uVar22 = uVar21;
          } while (local_d8 != local_90);
        }
      }
    }
    else if (vector->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      phVar2 = (hugeint_t *)result->data;
      pdVar3 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        ConstantVector::SetNull(result,false);
        local_88.sel = *(SelectionVector **)pdVar3;
        local_88.data = *(data_ptr_t *)(pdVar3 + 8);
        hugeint_t::hugeint_t(&local_108,0);
        bVar10 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
        if (bVar10) {
          hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
        }
        else {
          hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
        }
        local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
        hVar26 = hugeint_t::operator*(&local_108,&local_c8);
        *phVar2 = hVar26;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_88);
      Vector::ToUnifiedFormat(vector,local_110,&local_88);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar3 = result->data;
      local_f0 = local_88.data;
      FlatVector::VerifyFlatVector(result);
      if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (local_110 != 0) {
          psVar5 = (local_88.sel)->sel_vector;
          piVar25 = (int64_t *)(pdVar3 + 8);
          iVar23 = 0;
          do {
            iVar19 = iVar23;
            if (psVar5 != (sel_t *)0x0) {
              iVar19 = (idx_t)psVar5[iVar23];
            }
            local_108 = *(hugeint_t *)(local_f0 + iVar19 * 0x10);
            hugeint_t::hugeint_t(&local_a8,0);
            bVar10 = hugeint_t::operator<(&local_108,&local_a8);
            if (bVar10) {
              hugeint_t::operator-=(&local_108,&local_e8);
            }
            else {
              hugeint_t::operator+=(&local_108,&local_e8);
            }
            local_a8 = hugeint_t::operator/(&local_108,&local_b8);
            hVar26 = hugeint_t::operator*(&local_a8,&local_c8);
            piVar25[-1] = hVar26.lower;
            *piVar25 = hVar26.upper;
            iVar23 = iVar23 + 1;
            piVar25 = piVar25 + 2;
          } while (local_110 != iVar23);
        }
      }
      else if (local_110 != 0) {
        psVar5 = (local_88.sel)->sel_vector;
        local_d0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        piVar25 = (int64_t *)(pdVar3 + 8);
        uVar22 = 0;
        do {
          uVar16 = uVar22;
          if (psVar5 != (sel_t *)0x0) {
            uVar16 = (ulong)psVar5[uVar22];
          }
          if ((local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            _Var18._M_head_impl =
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (_Var18._M_head_impl == (unsigned_long *)0x0) {
              local_a8.lower =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_a8.lower);
              uVar6 = local_108.lower;
              iVar7 = local_108.upper;
              local_108 = (hugeint_t)ZEXT816(0);
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar6;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar7;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.upper !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.upper);
                }
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_d0);
              _Var18._M_head_impl =
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   _Var18._M_head_impl;
            }
            bVar8 = (byte)uVar22 & 0x3f;
            _Var18._M_head_impl[uVar22 >> 6] =
                 _Var18._M_head_impl[uVar22 >> 6] &
                 (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
          }
          else {
            local_108 = *(hugeint_t *)(local_f0 + uVar16 * 0x10);
            hugeint_t::hugeint_t(&local_a8,0);
            bVar10 = hugeint_t::operator<(&local_108,&local_a8);
            if (bVar10) {
              hugeint_t::operator-=(&local_108,&local_e8);
            }
            else {
              hugeint_t::operator+=(&local_108,&local_e8);
            }
            local_a8 = hugeint_t::operator/(&local_108,&local_b8);
            hVar26 = hugeint_t::operator*(&local_a8,&local_c8);
            piVar25[-1] = hVar26.lower;
            *piVar25 = hVar26.upper;
          }
          uVar22 = uVar22 + 1;
          piVar25 = piVar25 + 2;
        } while (local_110 != uVar22);
      }
      if (local_88.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_88,0);
    Vector::SetValue(result,0,(Value *)&local_88);
    Value::~Value((Value *)&local_88);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}